

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O1

int asio_service_test::try_adding_server
              (RaftAsioPkg *leader,RaftAsioPkg *srv_to_add,size_t count_limit)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint uVar3;
  cmd_result_code __val;
  uint uVar4;
  uint uVar5;
  cmd_result_code cVar6;
  cmd_result_code cVar7;
  long *plVar8;
  ulong uVar9;
  size_type *psVar10;
  long *plVar11;
  uint uVar12;
  uint uVar13;
  string __str;
  string ret_string;
  ptr<cmd_result<ptr<buffer>_>_> ret;
  string __str_1;
  bool local_c9;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  undefined1 local_80 [48];
  size_t local_50;
  RaftAsioPkg *local_48;
  RaftAsioPkg *local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  local_c9 = count_limit == 0;
  if (!local_c9) {
    local_38.__d.__r = (duration)0;
    local_50 = count_limit;
    local_48 = leader;
    local_40 = srv_to_add;
    do {
      peVar1 = (local_40->sMgr).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pp_Var2 = peVar1[8]._vptr_state_mgr;
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1[9]._vptr_state_mgr;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      nuraft::raft_server::add_srv
                ((raft_server *)local_80,
                 (srv_config *)
                 (local_48->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar12 = *(uint *)pp_Var2;
      uVar3 = -uVar12;
      if (0 < (int)uVar12) {
        uVar3 = uVar12;
      }
      uVar13 = 1;
      if (9 < uVar3) {
        uVar9 = (ulong)uVar3;
        uVar4 = 4;
        do {
          uVar13 = uVar4;
          uVar5 = (uint)uVar9;
          if (uVar5 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_001b035d;
          }
          if (uVar5 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_001b035d;
          }
          if (uVar5 < 10000) goto LAB_001b035d;
          uVar9 = uVar9 / 10000;
          uVar4 = uVar13 + 4;
        } while (99999 < uVar5);
        uVar13 = uVar13 + 1;
      }
LAB_001b035d:
      local_c0 = &local_b0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_c0,(char)uVar13 - (char)((int)uVar12 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_c0),uVar13,uVar3);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x4be6f6);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_a0.field_2._M_allocated_capacity = *psVar10;
        local_a0.field_2._8_8_ = plVar8[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar10;
        local_a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_80._0_8_);
      if (cVar6 != OK) {
        cVar7 = nuraft::
                cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_80._0_8_);
        __val = -cVar7;
        if (OK < cVar7) {
          __val = cVar7;
        }
        uVar12 = 1;
        if (9 < (uint)__val) {
          uVar9 = (ulong)(uint)__val;
          uVar3 = 4;
          do {
            uVar12 = uVar3;
            uVar13 = (uint)uVar9;
            if (uVar13 < 100) {
              uVar12 = uVar12 - 2;
              goto LAB_001b0475;
            }
            if (uVar13 < 1000) {
              uVar12 = uVar12 - 1;
              goto LAB_001b0475;
            }
            if (uVar13 < 10000) goto LAB_001b0475;
            uVar9 = uVar9 / 10000;
            uVar3 = uVar12 + 4;
          } while (99999 < uVar13);
          uVar12 = uVar12 + 1;
        }
LAB_001b0475:
        local_80._16_8_ = local_80 + 0x20;
        std::__cxx11::string::_M_construct
                  ((ulong)(local_80 + 0x10),(char)uVar12 - (char)(cVar7 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)(_func_int ***)local_80._16_8_ + (ulong)((uint)cVar7 >> 0x1f)),
                   uVar12,__val);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_80 + 0x10),0,(char *)0x0,0x4be6ff);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_b0 = *plVar11;
          lStack_a8 = plVar8[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar11;
          local_c0 = (long *)*plVar8;
        }
        local_b8 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
        if (local_c0 != &local_b0) {
          operator_delete(local_c0);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x20)) {
          operator_delete((void *)local_80._16_8_);
        }
      }
      TestSuite::sleep_sec(1,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((element_type *)local_80._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (cVar6 == OK) break;
      local_38.__d.__r = (duration)((long)local_38.__d.__r + 1);
      local_c9 = local_50 <= (ulong)local_38.__d.__r;
    } while (local_38.__d.__r != (duration)local_50);
  }
  return -(uint)local_c9;
}

Assistant:

int try_adding_server( RaftAsioPkg& leader,
                       const RaftAsioPkg& srv_to_add,
                       size_t count_limit = 3 )
{
    for (size_t ii = 0; ii < count_limit; ++ii) {
        ptr<srv_config> s_conf = srv_to_add.getTestMgr()->get_srv_config();
        ptr< cmd_result< ptr<buffer> > > ret = leader.raftServer->add_srv(*s_conf);

        std::string ret_string = "adding S" + std::to_string(s_conf->get_id());
        bool succeeded = false;

        if (ret->get_result_code() == cmd_result_code::OK) {
            succeeded = true;
        } else {
            ret_string += " failed: " + std::to_string(ret->get_result_code());
        }
        TestSuite::sleep_sec(1, ret_string);
        if (succeeded) {
            return 0;
        }
    }
    return -1;
}